

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TACBuilderVisitor.cpp
# Opt level: O2

void __thiscall
hdc::TACBuilderVisitor::visit(TACBuilderVisitor *this,AssignmentExpression *expression)

{
  bool bVar1;
  int src1;
  Expression *pEVar2;
  
  bVar1 = this->checkingAssignment;
  this->checkingAssignment = false;
  pEVar2 = BinaryOperator::getRight(&expression->super_BinaryOperator);
  (**(pEVar2->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar2,this);
  src1 = this->lastTemporary;
  this->checkingAssignment = true;
  pEVar2 = BinaryOperator::getLeft(&expression->super_BinaryOperator);
  (**(pEVar2->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar2,this);
  emit(this,TAC_SW,this->lastTemporary,src1,this->lastTemporary);
  this->checkingAssignment = bVar1;
  return;
}

Assistant:

void TACBuilderVisitor::visit(AssignmentExpression* expression) {
    int tmp1 = -1;
    int tmp2 = -1;
    int dst = -1;
    bool oldCheckingAssignment;

    oldCheckingAssignment = checkingAssignment;

    checkingAssignment = false;
    expression->getRight()->accept(this);
    tmp1 = lastTemporary;

    checkingAssignment = true;
    expression->getLeft()->accept(this);
    dst = lastTemporary;
    tmp2 = dst;

    emit(TAC_SW, dst, tmp1, tmp2);
    checkingAssignment = oldCheckingAssignment;
}